

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_connector_tcp.c
# Opt level: O0

void connector_close_cb(uv_handle_t *handle)

{
  uint uVar1;
  undefined8 *__s;
  uint reconnect_delay;
  connector_timer_s *timer;
  asterism_tcp_connector_s *obj;
  int ret;
  uv_handle_t *handle_local;
  
  if (handle[0x30].handle_queue[0] != (void *)0x0) {
    close_hearbeat(handle);
    *(undefined8 *)((long)handle[0x30].handle_queue[0] + 0xa0) = 0;
  }
  if ((*(byte *)((long)handle[2].u.reserved[1] + 0x78) & 1) == 1) {
    connector_delete((asterism_tcp_connector_s *)&handle[-1].flags);
  }
  else {
    __s = (undefined8 *)malloc(0xa8);
    memset(__s,0,0xa8);
    __s[1] = __s;
    *__s = reconnect_timer_close;
    __s[0x14] = &handle[-1].flags;
    uVar1 = *(uint *)((long)handle[2].u.reserved[1] + 0x4c);
    uv_timer_init(*(uv_loop_t **)((long)handle[2].u.reserved[1] + 0x70),(uv_timer_t *)(__s + 1));
    uv_timer_start((uv_timer_t *)(__s + 1),reconnect_timer_cb,(ulong)uVar1,(ulong)uVar1);
  }
  _asterism_log(ASTERISM_LOG_DEBUG,
                "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/src/asterism/asterism_connector_tcp.c(72)"
                ,"connector is closed");
  return;
}

Assistant:

static void connector_close_cb(
    uv_handle_t *handle)
{
    int ret = 0;
    struct asterism_tcp_connector_s *obj = __CONTAINER_PTR(struct asterism_tcp_connector_s, socket, handle);
    if (obj->heartbeat_timer)
    {
        close_hearbeat(handle);
        obj->heartbeat_timer->connector = 0;
    }
    if (obj->as->stoped != 1)
    {
        struct connector_timer_s *timer = AS_ZMALLOC(struct connector_timer_s);
        ASTERISM_HANDLE_INIT(timer, timer, reconnect_timer_close);
        timer->connector = obj;
        unsigned int reconnect_delay = obj->as->reconnect_delay;
        uv_timer_init(obj->as->loop, &timer->timer);
        uv_timer_start(&timer->timer, reconnect_timer_cb, reconnect_delay, reconnect_delay);
    }
    else
    {
        connector_delete(obj);
    }
    asterism_log(ASTERISM_LOG_DEBUG, "connector is closed");
}